

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

void __thiscall
Centaurus::Grammar<unsigned_char>::print_catn
          (Grammar<unsigned_char> *this,wostream *os,Identifier *id)

{
  const_iterator cVar1;
  CompositeATN<unsigned_char> catn;
  CompositeATN<unsigned_char> local_60;
  
  CompositeATN<unsigned_char>::CompositeATN(&local_60,this);
  cVar1 = std::
          _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_60.m_dict._M_h,id);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    CATNMachine<unsigned_char>::print
              ((CATNMachine<unsigned_char> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
                      ._M_cur + 0x30),os,&id->m_id);
    local_60._vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_0019c088;
    std::
    _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_60.m_dict._M_h);
    return;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void Grammar<TCHAR>::print_catn(std::wostream& os, const Identifier& id) const
{
    CompositeATN<TCHAR> catn(*this);

    catn[id].print(os, id.str());
}